

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O1

void test_AString_insertAString_success_middleIndex_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *expr;
  char *pcVar5;
  char **ppcVar6;
  char **ppcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcStack_c0;
  char *pcStack_b8;
  char *pcStack_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined8 uStack_90;
  AString srcString;
  AString destString;
  
  destString.reallocator._0_4_ = 0x11e238;
  destString.reallocator._4_4_ = 0;
  destString.deallocator._0_4_ = 0x11e278;
  destString.deallocator._4_4_ = 0;
  destString.buffer = (char *)0x0;
  destString.size = 5;
  destString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x128396;
  destString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(destString.buffer,"01567",6);
  srcString.buffer = (char *)0x0;
  srcString.reallocator._0_4_ = 0x11e238;
  srcString.reallocator._4_4_ = 0;
  srcString.deallocator._0_4_ = 0x11e278;
  srcString.deallocator._4_4_ = 0;
  srcString.size = 3;
  srcString.capacity = 8;
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x1283f6;
  srcString.buffer = (char *)private_ACUtilsTest_AString_realloc((void *)0x0,9);
  private_ACUtilsTest_AString_reallocCount = 0;
  private_ACUtilsTest_AString_freeCount = 0;
  builtin_strncpy(srcString.buffer,"234",4);
  private_ACUtilsTest_AString_reallocFail = 0;
  uStack_90 = 0x12842c;
  bVar1 = AString_insertAString(&destString,2,&srcString);
  if (bVar1 == false) {
    uStack_90 = 0x1285c5;
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x336,
                      "Assertion \'AString_insertAString(&destString, 2, &srcString)\' failed",0,0);
  }
  uStack_90 = 0x128445;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x336);
  if (destString.capacity != 8) {
    local_a0 = "(8)";
    pcVar8 = "(destString).capacity == (8)";
    pcVar4 = "(destString).capacity";
    pcVar5 = (char *)destString.capacity;
LAB_001286af:
    iVar2 = 0x337;
LAB_001286e5:
    local_98 = (char *)0x8;
LAB_001287c2:
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    ppcVar6 = &local_a0;
    goto LAB_001287c4;
  }
  uStack_90 = 0x128465;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x337);
  if (destString.buffer == (char *)0x0) {
    ppcVar7 = &local_98;
    pcVar5 = "Assertion \'_ck_x != NULL\' failed";
    pcVar4 = "Assertion \'%s\' failed: %s == %#x";
    pcVar8 = "(void*) (destString).buffer != NULL";
    pcVar9 = "(void*) (destString).buffer";
    iVar2 = 0x337;
    goto LAB_0012880f;
  }
  uStack_90 = 0x128482;
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x337);
  pcVar9 = destString.buffer;
  if (destString.buffer == (char *)0x0) {
    pcVar5 = "";
    pcVar9 = "(null)";
LAB_00128643:
    local_a0 = "01234567";
    pcStack_b0 = "(\"01234567\")";
    pcVar8 = "(destString).buffer == (\"01234567\")";
    pcVar4 = "(void*) (destString).buffer";
    iVar2 = 0x337;
  }
  else {
    uStack_90 = 0x12849f;
    iVar2 = strcmp("01234567",destString.buffer);
    if (iVar2 != 0) {
      pcVar5 = "\"";
      goto LAB_00128643;
    }
    uStack_90 = 0x1284b8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x337);
    if (destString.size != 8) {
      local_a0 = "strlen(\"01234567\")";
      pcVar8 = "(destString).size == strlen(\"01234567\")";
      pcVar4 = "(destString).size";
      pcVar5 = (char *)destString.size;
      goto LAB_001286af;
    }
    uStack_90 = 0x1284d8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x337);
    if (srcString.capacity != 8) {
      local_a0 = "(8)";
      pcVar8 = "(srcString).capacity == (8)";
      pcVar4 = "(srcString).capacity";
      iVar2 = 0x338;
      pcVar5 = (char *)srcString.capacity;
      goto LAB_001286e5;
    }
    uStack_90 = 0x1284f8;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x338);
    if (srcString.buffer == (char *)0x0) {
      ppcVar7 = &local_98;
      pcVar5 = "Assertion \'_ck_x != NULL\' failed";
      pcVar4 = "Assertion \'%s\' failed: %s == %#x";
      pcVar8 = "(void*) (srcString).buffer != NULL";
      pcVar9 = "(void*) (srcString).buffer";
      iVar2 = 0x338;
LAB_0012880f:
      uStack_90 = 0;
      local_98 = (char *)0x0;
      *(code **)((long)ppcVar7 + -8) = test_AString_insertAString_success_endIndex_fn;
      _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,iVar2,pcVar5,pcVar4,pcVar8,pcVar9);
    }
    uStack_90 = 0x128515;
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x338);
    pcVar9 = srcString.buffer;
    if (srcString.buffer == (char *)0x0) {
      pcVar9 = "(null)";
      pcVar5 = "";
    }
    else {
      uStack_90 = 0x128532;
      iVar2 = strcmp("234",srcString.buffer);
      if (iVar2 == 0) {
        uStack_90 = 0x12854b;
        _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,0x338);
        if (srcString.size == 3) {
          uStack_90 = 0x12856b;
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x338);
          if (private_ACUtilsTest_AString_reallocCount == 0) {
            uStack_90 = 0x12858c;
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x339);
            uStack_90 = 0x128595;
            (*(code *)CONCAT44(destString.deallocator._4_4_,destString.deallocator._0_4_))
                      (destString.buffer);
            uStack_90 = 0x12859e;
            (*(code *)CONCAT44(srcString.deallocator._4_4_,srcString.deallocator._0_4_))
                      (srcString.buffer);
            return;
          }
          ppcVar7 = &local_a8;
          local_a0 = "(0)";
          local_a8 = (char *)private_ACUtilsTest_AString_reallocCount;
          pcVar5 = "Assertion \'_ck_x == _ck_y\' failed";
          pcVar4 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
          pcVar8 = "private_ACUtilsTest_AString_reallocCount == (0)";
          pcVar9 = "private_ACUtilsTest_AString_reallocCount";
          iVar2 = 0x339;
          goto LAB_0012880f;
        }
        local_a0 = "strlen(\"234\")";
        pcVar8 = "(srcString).size == strlen(\"234\")";
        pcVar4 = "(srcString).size";
        iVar2 = 0x338;
        local_98 = (char *)0x3;
        pcVar5 = (char *)srcString.size;
        goto LAB_001287c2;
      }
      pcVar5 = "\"";
    }
    local_a0 = "234";
    pcStack_b0 = "(\"234\")";
    pcVar8 = "(srcString).buffer == (\"234\")";
    pcVar4 = "(void*) (srcString).buffer";
    iVar2 = 0x338;
  }
  pcVar4 = pcVar4 + 8;
  expr = 
  "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
  ;
  pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
  local_98 = "\"";
  local_a8 = "\"";
  ppcVar6 = &pcStack_c0;
  pcStack_c0 = pcVar9;
  pcStack_b8 = pcVar5;
LAB_001287c4:
  uStack_90 = 0;
  *(char **)((long)ppcVar6 + -8) = pcVar5;
  *(undefined8 *)((long)ppcVar6 + -0x10) = 0x1287cb;
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar8,pcVar4);
}

Assistant:

END_TEST
START_TEST(test_AString_insertAString_success_middleIndex)
{
    struct AString destString = private_ACUtilsTest_AString_constructTestString("01567", 8);
    struct AString srcString = private_ACUtilsTest_AString_constructTestString("234", 8);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_insertAString(&destString, 2, &srcString));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(destString, "01234567", 8);
    ACUTILSTEST_ASTRING_CHECK_ASTRING(srcString, "234", 8);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(destString);
    private_ACUtilsTest_AString_destructTestString(srcString);
}